

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_20::ComputeJacobian
          (ChElementHexaCorot_20 *this,ChMatrixDynamic<> *Jacobian,ChMatrixDynamic<> *J1,
          ChVector<double> *coord)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  LhsNested pMVar5;
  RhsNested pMVar6;
  Scalar SVar7;
  Scalar *pSVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_70;
  Scalar local_60;
  ChMatrixDynamic<> J2;
  int local_3c;
  undefined1 local_38 [16];
  
  local_70.m_lhs._0_4_ = 0x14;
  local_3c = 3;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&J2,(int *)&local_70,&local_3c);
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(auVar38,ZEXT816(0xc000000000000000),ZEXT816(0xbff0000000000000));
  *pSVar8 = (1.0 - dVar3) * (1.0 - dVar2) * ((auVar4._0_8_ - dVar2) - dVar3) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,1);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(auVar39,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  *pSVar8 = (1.0 - dVar2) * (1.0 - dVar3) * ((auVar4._0_8_ - dVar2) - dVar3) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,2);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(auVar40,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  *pSVar8 = (dVar2 + 1.0) * (1.0 - dVar3) * ((dVar2 + auVar4._0_8_) - dVar3) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,3);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(auVar41,ZEXT816(0xc000000000000000),ZEXT816(0xbff0000000000000));
  *pSVar8 = (1.0 - dVar3) * (dVar2 + 1.0) * ((dVar2 + auVar4._0_8_) - dVar3) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,4);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(auVar42,ZEXT816(0xc000000000000000),ZEXT816(0xbff0000000000000));
  *pSVar8 = (dVar3 + 1.0) * (1.0 - dVar2) * (dVar3 + (auVar4._0_8_ - dVar2)) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,5);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(auVar43,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
  *pSVar8 = (1.0 - dVar2) * (dVar3 + 1.0) * (dVar3 + (auVar4._0_8_ - dVar2)) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,6);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar68,ZEXT816(0xbff0000000000000));
  *pSVar8 = (dVar2 + 1.0) * (dVar3 + 1.0) * (dVar3 + dVar2 + auVar4._0_8_) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,7);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar1;
  auVar4 = vfmadd213sd_fma(ZEXT816(0xc000000000000000),auVar69,ZEXT816(0xbff0000000000000));
  *pSVar8 = (dVar3 + 1.0) * (dVar2 + 1.0) * (dVar3 + dVar2 + auVar4._0_8_) * -0.125;
  dVar1 = coord->m_data[0];
  auVar4 = *(undefined1 (*) [16])(coord->m_data + 1);
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,8);
  local_38._8_8_ = 0x3ff0000000000000;
  local_38._0_8_ = 0x3ff0000000000000;
  auVar9 = vsubpd_avx(local_38,auVar4);
  auVar4 = vshufpd_avx(auVar9,auVar9,1);
  *pSVar8 = auVar9._0_8_ * dVar1 * auVar4._0_8_ * -0.5;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar10,auVar10,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (1.0 - dVar2) * 0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,10);
  *pSVar8 = (dVar2 + 1.0) * dVar1 * (1.0 - dVar3) * -0.5;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0xb);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar44,auVar44,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (1.0 - dVar2) * auVar4._0_8_ * -0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  auVar4 = *(undefined1 (*) [16])(coord->m_data + 1);
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0xc);
  auVar4 = vshufpd_avx(auVar4,auVar4,1);
  *pSVar8 = (1.0 - dVar2) * dVar1 * (auVar4._0_8_ + 1.0) * -0.5;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0xd);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar11,auVar11,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (dVar2 + 1.0) * 0.25;
  dVar1 = coord->m_data[0];
  auVar9 = *(undefined1 (*) [16])(coord->m_data + 1);
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0xe);
  auVar4._8_8_ = 0x3ff0000000000000;
  auVar4._0_8_ = 0x3ff0000000000000;
  auVar9 = vaddpd_avx512vl(auVar9,auVar4);
  auVar4 = vshufpd_avx(auVar9,auVar9,1);
  *pSVar8 = auVar9._0_8_ * dVar1 * auVar4._0_8_ * -0.5;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0xf);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar45,auVar45,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (dVar2 + 1.0) * auVar4._0_8_ * -0.25;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0x10);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar46,auVar46,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (1.0 - dVar1) * auVar4._0_8_ * 0.25;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0x11);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar47,auVar47,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (dVar1 + 1.0) * auVar4._0_8_ * 0.25;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0x12);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar12,auVar12,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (dVar1 + 1.0) * -0.25;
  dVar1 = coord->m_data[1];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,0,0x13);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar13,auVar13,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (1.0 - dVar1) * -0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = -1.0 - dVar1;
  auVar4 = vfmadd231sd_fma(auVar14,auVar70,ZEXT816(0xc000000000000000));
  *pSVar8 = (1.0 - dVar3) * (1.0 - dVar1) * (auVar4._0_8_ - dVar3) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,1);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar2;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1 + -1.0;
  auVar4 = vfmadd231sd_fma(auVar15,auVar64,ZEXT816(0xc000000000000000));
  *pSVar8 = (1.0 - dVar3) * (dVar1 + 1.0) * (auVar4._0_8_ - dVar3) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,2);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1 + -1.0;
  auVar4 = vfmadd231sd_fma(auVar16,auVar65,ZEXT816(0x4000000000000000));
  *pSVar8 = (dVar1 + 1.0) * (1.0 - dVar3) * (auVar4._0_8_ - dVar3) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,3);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = -1.0 - dVar1;
  auVar4 = vfmadd231sd_fma(auVar17,auVar71,ZEXT816(0x4000000000000000));
  *pSVar8 = (1.0 - dVar1) * (1.0 - dVar3) * (auVar4._0_8_ - dVar3) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,4);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = -1.0 - dVar1;
  auVar4 = vfmadd231sd_fma(auVar18,auVar72,ZEXT816(0xc000000000000000));
  *pSVar8 = (dVar3 + 1.0) * (1.0 - dVar1) * (dVar3 + auVar4._0_8_) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,5);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1 + -1.0;
  auVar4 = vfmadd231sd_fma(auVar19,auVar66,ZEXT816(0xc000000000000000));
  *pSVar8 = (dVar3 + 1.0) * (dVar1 + 1.0) * (dVar3 + auVar4._0_8_) * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,6);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar1 + -1.0;
  auVar4 = vfmadd231sd_fma(auVar20,auVar67,ZEXT816(0x4000000000000000));
  *pSVar8 = (dVar1 + 1.0) * (dVar3 + 1.0) * (dVar3 + auVar4._0_8_) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,7);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar2;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = -1.0 - dVar1;
  auVar4 = vfmadd231sd_fma(auVar21,auVar73,ZEXT816(0x4000000000000000));
  *pSVar8 = (1.0 - dVar1) * (dVar3 + 1.0) * (dVar3 + auVar4._0_8_) * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,8);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar48,auVar48,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (1.0 - dVar2) * auVar4._0_8_ * -0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,9);
  *pSVar8 = (dVar1 + 1.0) * dVar2 * (1.0 - dVar3) * -0.5;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,10);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar22,auVar22,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (1.0 - dVar2) * 0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0xb);
  *pSVar8 = (1.0 - dVar1) * dVar2 * (1.0 - dVar3) * -0.5;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0xc);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar49,auVar49,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (dVar2 + 1.0) * auVar4._0_8_ * -0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0xd);
  *pSVar8 = (dVar1 + 1.0) * dVar2 * (dVar3 + 1.0) * -0.5;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0xe);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar23,auVar23,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (dVar2 + 1.0) * 0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0xf);
  *pSVar8 = (1.0 - dVar1) * dVar2 * (dVar3 + 1.0) * -0.5;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0x10);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar24,auVar24,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (dVar1 + 1.0) * -0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0x11);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar50,auVar50,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (dVar1 + 1.0) * auVar4._0_8_ * 0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0x12);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar51,auVar51,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (1.0 - dVar1) * auVar4._0_8_ * 0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,1,0x13);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar25,auVar25,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (1.0 - dVar1) * -0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar3;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (-1.0 - dVar1) - dVar2;
  auVar4 = vfmadd231sd_fma(auVar26,auVar52,ZEXT816(0xc000000000000000));
  *pSVar8 = (1.0 - dVar2) * (1.0 - dVar1) * auVar4._0_8_ * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,1);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar3;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = (dVar1 + -1.0) - dVar2;
  auVar4 = vfmadd231sd_fma(auVar27,auVar53,ZEXT816(0xc000000000000000));
  *pSVar8 = (1.0 - dVar2) * (dVar1 + 1.0) * auVar4._0_8_ * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,2);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar3;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar1 + -1.0 + dVar2;
  auVar4 = vfmadd231sd_fma(auVar28,auVar54,ZEXT816(0xc000000000000000));
  *pSVar8 = (dVar2 + 1.0) * (dVar1 + 1.0) * auVar4._0_8_ * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,3);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar3;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (-1.0 - dVar1) + dVar2;
  auVar4 = vfmadd231sd_fma(auVar29,auVar55,ZEXT816(0xc000000000000000));
  *pSVar8 = (dVar2 + 1.0) * (1.0 - dVar1) * auVar4._0_8_ * -0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,4);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar3;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = (-1.0 - dVar1) - dVar2;
  auVar4 = vfmadd231sd_fma(auVar30,auVar56,ZEXT816(0x4000000000000000));
  *pSVar8 = (1.0 - dVar1) * (1.0 - dVar2) * auVar4._0_8_ * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,5);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar3;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (dVar1 + -1.0) - dVar2;
  auVar4 = vfmadd231sd_fma(auVar31,auVar57,ZEXT816(0x4000000000000000));
  *pSVar8 = (dVar1 + 1.0) * (1.0 - dVar2) * auVar4._0_8_ * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,6);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar3;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1 + -1.0 + dVar2;
  auVar4 = vfmadd231sd_fma(auVar32,auVar58,ZEXT816(0x4000000000000000));
  *pSVar8 = (dVar1 + 1.0) * (dVar2 + 1.0) * auVar4._0_8_ * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  dVar3 = coord->m_data[2];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,7);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar3;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (-1.0 - dVar1) + dVar2;
  auVar4 = vfmadd231sd_fma(auVar33,auVar59,ZEXT816(0x4000000000000000));
  *pSVar8 = (1.0 - dVar1) * (dVar2 + 1.0) * auVar4._0_8_ * 0.125;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,8);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar60,auVar60,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (1.0 - dVar2) * auVar4._0_8_ * -0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,9);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar34,auVar34,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (dVar1 + 1.0) * -0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,10);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar61,auVar61,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (dVar2 + 1.0) * auVar4._0_8_ * -0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0xb);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar35,auVar35,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (1.0 - dVar1) * -0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0xc);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar36,auVar36,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (1.0 - dVar2) * 0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0xd);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar62,auVar62,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (dVar1 + 1.0) * auVar4._0_8_ * 0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0xe);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar1;
  auVar4 = vfnmadd213sd_fma(auVar37,auVar37,ZEXT816(0x3ff0000000000000));
  *pSVar8 = auVar4._0_8_ * (dVar2 + 1.0) * 0.25;
  dVar1 = coord->m_data[0];
  dVar2 = coord->m_data[1];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0xf);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = dVar2;
  auVar4 = vfnmadd213sd_fma(auVar63,auVar63,ZEXT816(0x3ff0000000000000));
  *pSVar8 = (1.0 - dVar1) * auVar4._0_8_ * 0.25;
  dVar1 = coord->m_data[2];
  dVar2 = coord->m_data[0];
  dVar3 = coord->m_data[1];
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0x10);
  *pSVar8 = (dVar2 + 1.0) * dVar1 * (1.0 - dVar3) * -0.5;
  dVar1 = coord->m_data[2];
  auVar4 = *(undefined1 (*) [16])coord->m_data;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0x11);
  auVar9._8_8_ = 0x3ff0000000000000;
  auVar9._0_8_ = 0x3ff0000000000000;
  auVar9 = vaddpd_avx512vl(auVar4,auVar9);
  auVar4 = vshufpd_avx(auVar9,auVar9,1);
  *pSVar8 = auVar9._0_8_ * dVar1 * auVar4._0_8_ * -0.5;
  dVar1 = coord->m_data[2];
  dVar2 = coord->m_data[0];
  auVar4 = *(undefined1 (*) [16])coord->m_data;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0x12);
  auVar4 = vshufpd_avx(auVar4,auVar4,1);
  *pSVar8 = (1.0 - dVar2) * dVar1 * (auVar4._0_8_ + 1.0) * -0.5;
  dVar1 = coord->m_data[2];
  auVar4 = *(undefined1 (*) [16])coord->m_data;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)J1,2,0x13);
  auVar9 = vsubpd_avx(local_38,auVar4);
  auVar4 = vshufpd_avx(auVar9,auVar9,1);
  *pSVar8 = auVar9._0_8_ * dVar1 * auVar4._0_8_ * -0.5;
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,1,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,2,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,3,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,4,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,5,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,6,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,7,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[8].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,8,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[9].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,9,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[10].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,10,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xb].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xb,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xc].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xc,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xd].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xd,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xe].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xe,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xf].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xf,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x10].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x10,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x11].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x11,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x12].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x12,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x13].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar5 = local_70.m_lhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x13,0);
  *pSVar8 = (Scalar)pMVar5;
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,1,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,2,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,3,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,4,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,5,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,6,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,7,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[8].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,8,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[9].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,9,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[10].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,10,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xb].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xb,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xc].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xc,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xd].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xd,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xe].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xe,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xf].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xf,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x10].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x10,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x11].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x11,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x12].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x12,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x13].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pMVar6 = local_70.m_rhs;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x13,1);
  *pSVar8 = (Scalar)pMVar6;
  (**(code **)(*(long *)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,1,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,2,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,3,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[4].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,4,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[5].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,5,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[6].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,6,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[7].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,7,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[8].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,8,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[9].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,9,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[10].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,10,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xb].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xb,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xc].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xc,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xd].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xd,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xe].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xe,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0xf].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0xf,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x10].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x10,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x11].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x11,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x12].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  SVar7 = local_60;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x12,2);
  *pSVar8 = SVar7;
  (**(code **)(*(long *)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[0x13].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_70);
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&J2,0x13,2);
  *pSVar8 = local_60;
  local_70 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)J1,
                        (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&J2);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            (Jacobian,&local_70);
  Eigen::internal::handmade_aligned_free
            (J2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void ChElementHexaCorot_20::ComputeJacobian(ChMatrixDynamic<>& Jacobian, ChMatrixDynamic<>& J1, ChVector<> coord) {
    ChMatrixDynamic<> J2(20, 3);

    J1(0, 0) = -(1 - coord.y()) * (1 - coord.z()) * (-1 - 2 * coord.x() - coord.y() - coord.z()) / 8;
    J1(0, 1) = +(1 - coord.y()) * (1 - coord.z()) * (-1 + 2 * coord.x() - coord.y() - coord.z()) / 8;
    J1(0, 2) = +(1 + coord.y()) * (1 - coord.z()) * (-1 + 2 * coord.x() + coord.y() - coord.z()) / 8;
    J1(0, 3) = -(1 + coord.y()) * (1 - coord.z()) * (-1 - 2 * coord.x() + coord.y() - coord.z()) / 8;
    J1(0, 4) = -(1 - coord.y()) * (1 + coord.z()) * (-1 - 2 * coord.x() - coord.y() + coord.z()) / 8;
    J1(0, 5) = +(1 - coord.y()) * (1 + coord.z()) * (-1 + 2 * coord.x() - coord.y() + coord.z()) / 8;
    J1(0, 6) = +(1 + coord.y()) * (1 + coord.z()) * (-1 + 2 * coord.x() + coord.y() + coord.z()) / 8;
    J1(0, 7) = -(1 + coord.y()) * (1 + coord.z()) * (-1 - 2 * coord.x() + coord.y() + coord.z()) / 8;
    J1(0, 8) = coord.x() * (1 - coord.y()) * (1 - coord.z()) / (-2);
    J1(0, 9) = +(1 - coord.y() * coord.y()) * (1 - coord.z()) / 4;
    J1(0, 10) = coord.x() * (1 + coord.y()) * (1 - coord.z()) / (-2);
    J1(0, 11) = -(1 - coord.y() * coord.y()) * (1 - coord.z()) / 4;
    J1(0, 12) = coord.x() * (1 - coord.y()) * (1 + coord.z()) / (-2);
    J1(0, 13) = +(1 - coord.y() * coord.y()) * (1 + coord.z()) / 4;
    J1(0, 14) = coord.x() * (1 + coord.y()) * (1 + coord.z()) / (-2);
    J1(0, 15) = -(1 - coord.y() * coord.y()) * (1 + coord.z()) / 4;
    J1(0, 16) = +(1 - coord.y()) * (1 - coord.z() * coord.z()) / 4;
    J1(0, 17) = +(1 + coord.y()) * (1 - coord.z() * coord.z()) / 4;
    J1(0, 18) = -(1 + coord.y()) * (1 - coord.z() * coord.z()) / 4;
    J1(0, 19) = -(1 - coord.y()) * (1 - coord.z() * coord.z()) / 4;

    J1(1, 0) = -(1 - coord.x()) * (1 - coord.z()) * (-1 - coord.x() - 2 * coord.y() - coord.z()) / 8;
    J1(1, 1) = -(1 + coord.x()) * (1 - coord.z()) * (-1 + coord.x() - 2 * coord.y() - coord.z()) / 8;
    J1(1, 2) = +(1 + coord.x()) * (1 - coord.z()) * (-1 + coord.x() + 2 * coord.y() - coord.z()) / 8;
    J1(1, 3) = +(1 - coord.x()) * (1 - coord.z()) * (-1 - coord.x() + 2 * coord.y() - coord.z()) / 8;
    J1(1, 4) = -(1 - coord.x()) * (1 + coord.z()) * (-1 - coord.x() - 2 * coord.y() + coord.z()) / 8;
    J1(1, 5) = -(1 + coord.x()) * (1 + coord.z()) * (-1 + coord.x() - 2 * coord.y() + coord.z()) / 8;
    J1(1, 6) = +(1 + coord.x()) * (1 + coord.z()) * (-1 + coord.x() + 2 * coord.y() + coord.z()) / 8;
    J1(1, 7) = +(1 - coord.x()) * (1 + coord.z()) * (-1 - coord.x() + 2 * coord.y() + coord.z()) / 8;
    J1(1, 8) = -(1 - coord.x() * coord.x()) * (1 - coord.z()) / 4;
    J1(1, 9) = coord.y() * (1 + coord.x()) * (1 - coord.z()) / (-2);
    J1(1, 10) = +(1 - coord.x() * coord.x()) * (1 - coord.z()) / 4;
    J1(1, 11) = coord.y() * (1 - coord.x()) * (1 - coord.z()) / (-2);
    J1(1, 12) = -(1 - coord.x() * coord.x()) * (1 + coord.z()) / 4;
    J1(1, 13) = coord.y() * (1 + coord.x()) * (1 + coord.z()) / (-2);
    J1(1, 14) = +(1 - coord.x() * coord.x()) * (1 + coord.z()) / 4;
    J1(1, 15) = coord.y() * (1 - coord.x()) * (1 + coord.z()) / (-2);
    J1(1, 16) = -(1 + coord.x()) * (1 - coord.z() * coord.z()) / 4;
    J1(1, 17) = +(1 + coord.x()) * (1 - coord.z() * coord.z()) / 4;
    J1(1, 18) = +(1 - coord.x()) * (1 - coord.z() * coord.z()) / 4;
    J1(1, 19) = -(1 - coord.x()) * (1 - coord.z() * coord.z()) / 4;

    J1(2, 0) = -(1 - coord.x()) * (1 - coord.y()) * (-1 - coord.x() - coord.y() - 2 * coord.z()) / 8;
    J1(2, 1) = -(1 + coord.x()) * (1 - coord.y()) * (-1 + coord.x() - coord.y() - 2 * coord.z()) / 8;
    J1(2, 2) = -(1 + coord.x()) * (1 + coord.y()) * (-1 + coord.x() + coord.y() - 2 * coord.z()) / 8;
    J1(2, 3) = -(1 - coord.x()) * (1 + coord.y()) * (-1 - coord.x() + coord.y() - 2 * coord.z()) / 8;
    J1(2, 4) = +(1 - coord.x()) * (1 - coord.y()) * (-1 - coord.x() - coord.y() + 2 * coord.z()) / 8;
    J1(2, 5) = +(1 + coord.x()) * (1 - coord.y()) * (-1 + coord.x() - coord.y() + 2 * coord.z()) / 8;
    J1(2, 6) = +(1 + coord.x()) * (1 + coord.y()) * (-1 + coord.x() + coord.y() + 2 * coord.z()) / 8;
    J1(2, 7) = +(1 - coord.x()) * (1 + coord.y()) * (-1 - coord.x() + coord.y() + 2 * coord.z()) / 8;
    J1(2, 8) = -(1 - coord.x() * coord.x()) * (1 - coord.y()) / 4;
    J1(2, 9) = -(1 + coord.x()) * (1 - coord.y() * coord.y()) / 4;
    J1(2, 10) = -(1 - coord.x() * coord.x()) * (1 + coord.y()) / 4;
    J1(2, 11) = -(1 - coord.x()) * (1 - coord.y() * coord.y()) / 4;
    J1(2, 12) = +(1 - coord.x() * coord.x()) * (1 - coord.y()) / 4;
    J1(2, 13) = +(1 + coord.x()) * (1 - coord.y() * coord.y()) / 4;
    J1(2, 14) = +(1 - coord.x() * coord.x()) * (1 + coord.y()) / 4;
    J1(2, 15) = +(1 - coord.x()) * (1 - coord.y() * coord.y()) / 4;
    J1(2, 16) = coord.z() * (1 + coord.x()) * (1 - coord.y()) / (-2);
    J1(2, 17) = coord.z() * (1 + coord.x()) * (1 + coord.y()) / (-2);
    J1(2, 18) = coord.z() * (1 - coord.x()) * (1 + coord.y()) / (-2);
    J1(2, 19) = coord.z() * (1 - coord.x()) * (1 - coord.y()) / (-2);

    J2(0, 0) = nodes[0]->GetX0().x();
    J2(1, 0) = nodes[1]->GetX0().x();
    J2(2, 0) = nodes[2]->GetX0().x();
    J2(3, 0) = nodes[3]->GetX0().x();
    J2(4, 0) = nodes[4]->GetX0().x();
    J2(5, 0) = nodes[5]->GetX0().x();
    J2(6, 0) = nodes[6]->GetX0().x();
    J2(7, 0) = nodes[7]->GetX0().x();
    J2(8, 0) = nodes[8]->GetX0().x();
    J2(9, 0) = nodes[9]->GetX0().x();
    J2(10, 0) = nodes[10]->GetX0().x();
    J2(11, 0) = nodes[11]->GetX0().x();
    J2(12, 0) = nodes[12]->GetX0().x();
    J2(13, 0) = nodes[13]->GetX0().x();
    J2(14, 0) = nodes[14]->GetX0().x();
    J2(15, 0) = nodes[15]->GetX0().x();
    J2(16, 0) = nodes[16]->GetX0().x();
    J2(17, 0) = nodes[17]->GetX0().x();
    J2(18, 0) = nodes[18]->GetX0().x();
    J2(19, 0) = nodes[19]->GetX0().x();

    J2(0, 1) = nodes[0]->GetX0().y();
    J2(1, 1) = nodes[1]->GetX0().y();
    J2(2, 1) = nodes[2]->GetX0().y();
    J2(3, 1) = nodes[3]->GetX0().y();
    J2(4, 1) = nodes[4]->GetX0().y();
    J2(5, 1) = nodes[5]->GetX0().y();
    J2(6, 1) = nodes[6]->GetX0().y();
    J2(7, 1) = nodes[7]->GetX0().y();
    J2(8, 1) = nodes[8]->GetX0().y();
    J2(9, 1) = nodes[9]->GetX0().y();
    J2(10, 1) = nodes[10]->GetX0().y();
    J2(11, 1) = nodes[11]->GetX0().y();
    J2(12, 1) = nodes[12]->GetX0().y();
    J2(13, 1) = nodes[13]->GetX0().y();
    J2(14, 1) = nodes[14]->GetX0().y();
    J2(15, 1) = nodes[15]->GetX0().y();
    J2(16, 1) = nodes[16]->GetX0().y();
    J2(17, 1) = nodes[17]->GetX0().y();
    J2(18, 1) = nodes[18]->GetX0().y();
    J2(19, 1) = nodes[19]->GetX0().y();

    J2(0, 2) = nodes[0]->GetX0().z();
    J2(1, 2) = nodes[1]->GetX0().z();
    J2(2, 2) = nodes[2]->GetX0().z();
    J2(3, 2) = nodes[3]->GetX0().z();
    J2(4, 2) = nodes[4]->GetX0().z();
    J2(5, 2) = nodes[5]->GetX0().z();
    J2(6, 2) = nodes[6]->GetX0().z();
    J2(7, 2) = nodes[7]->GetX0().z();
    J2(8, 2) = nodes[8]->GetX0().z();
    J2(9, 2) = nodes[9]->GetX0().z();
    J2(10, 2) = nodes[10]->GetX0().z();
    J2(11, 2) = nodes[11]->GetX0().z();
    J2(12, 2) = nodes[12]->GetX0().z();
    J2(13, 2) = nodes[13]->GetX0().z();
    J2(14, 2) = nodes[14]->GetX0().z();
    J2(15, 2) = nodes[15]->GetX0().z();
    J2(16, 2) = nodes[16]->GetX0().z();
    J2(17, 2) = nodes[17]->GetX0().z();
    J2(18, 2) = nodes[18]->GetX0().z();
    J2(19, 2) = nodes[19]->GetX0().z();

    Jacobian = J1 * J2;
}